

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void duckdb::StringValueResult::AddValue(StringValueResult *result,idx_t buffer_pos)

{
  ulong uVar1;
  char *pcVar2;
  idx_t size;
  
  uVar1 = (result->super_ScannerResult).last_position.buffer_pos;
  if (uVar1 <= buffer_pos) {
    if ((result->super_ScannerResult).quoted == true) {
      AddQuotedValue(result,buffer_pos - result->extra_delimiter_bytes);
    }
    else {
      pcVar2 = result->buffer_ptr;
      if ((result->super_ScannerResult).escaped == true) {
        AddPossiblyEscapedValue(result,buffer_pos,pcVar2 + uVar1,buffer_pos - uVar1,false);
      }
      else {
        size = HandleMultiDelimiter(result,buffer_pos);
        AddValueToVector(result,pcVar2 + uVar1,size,false);
      }
    }
    (result->super_ScannerResult).last_position.buffer_pos = buffer_pos + 1;
  }
  return;
}

Assistant:

void StringValueResult::AddValue(StringValueResult &result, const idx_t buffer_pos) {
	if (result.last_position.buffer_pos > buffer_pos) {
		return;
	}
	if (result.quoted) {
		AddQuotedValue(result, buffer_pos - result.extra_delimiter_bytes);
	} else if (result.escaped) {
		AddPossiblyEscapedValue(result, buffer_pos, result.buffer_ptr + result.last_position.buffer_pos,
		                        buffer_pos - result.last_position.buffer_pos, false);
	} else {
		result.AddValueToVector(result.buffer_ptr + result.last_position.buffer_pos,
		                        result.HandleMultiDelimiter(buffer_pos));
	}
	result.last_position.buffer_pos = buffer_pos + 1;
}